

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_sections_5(void)

{
  run("names missing in the current context are looked up in the stack",
      "\"{{#sec}}{{a}}, {{b}}, {{c.d}}{{/sec}}\"",
      "{\"a\": \"foo\", \"b\": \"wrong\", \"sec\": {\"b\": \"bar\"}, \"c\": {\"d\": \"baz\"}}",
      (char *)0x0,"\"foo, bar, baz\"");
  return;
}

Assistant:

static void
test_sections_5(void)
{
    run(
        "names missing in the current context are looked up in the stack",
        "\"{{#sec}}{{a}}, {{b}}, {{c.d}}{{/sec}}\"",
        "{\"a\": \"foo\", \"b\": \"wrong\", \"sec\": {\"b\": \"bar\"}, \"c\": {\"d\": \"baz\"}}",
        NULL,
        "\"foo, bar, baz\""
    );
}